

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::SelfTestData::SelfTestData(SelfTestData *this,Arena *arena)

{
  Arena *arena_local;
  SelfTestData *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SelfTestData_0039d620;
  google::protobuf::internal::ExtensionSet::ExtensionSet(&this->_extensions_,arena);
  google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::RepeatedPtrField
            (&this->samples_,arena);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  SharedCtor(this);
  RegisterArenaDtor(this,arena);
  return;
}

Assistant:

SelfTestData::SelfTestData(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena),
  samples_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.SelfTestData)
}